

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.h
# Opt level: O0

int64_t disruptor::GetMinimumSequence
                  (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *sequences,
                  int64_t minimum)

{
  bool bVar1;
  Sequence *in_RSI;
  int64_t sequence;
  Sequence *sequence_;
  const_iterator __end1;
  const_iterator __begin1;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *__range1;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_ffffffffffffffb8;
  Sequence *in_stack_ffffffffffffffc0;
  Sequence *in_stack_ffffffffffffffc8;
  __normal_iterator<disruptor::Sequence_*const_*,_std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>_>
  local_20 [2];
  Sequence *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_current =
       (Sequence **)
       std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::end
            (in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<disruptor::Sequence_*const_*,_std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>_>
                             *)in_stack_ffffffffffffffc0,
                            (__normal_iterator<disruptor::Sequence_*const_*,_std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    __gnu_cxx::
    __normal_iterator<disruptor::Sequence_*const_*,_std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>_>
    ::operator*(local_20);
    in_stack_ffffffffffffffc8 = (Sequence *)Sequence::sequence(in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc8;
    if ((long)local_10 < (long)in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc0 = local_10;
    }
    local_10 = in_stack_ffffffffffffffc0;
    __gnu_cxx::
    __normal_iterator<disruptor::Sequence_*const_*,_std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>_>
    ::operator++(local_20);
  }
  return (int64_t)local_10;
}

Assistant:

int64_t GetMinimumSequence(const std::vector<Sequence*>& sequences,
                           int64_t minimum = INT64_MAX) {
  for (Sequence* sequence_ : sequences) {
    const int64_t sequence = sequence_->sequence();
    minimum = minimum < sequence ? minimum : sequence;
  }

  return minimum;
}